

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleObjectLookup.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValueType VVar2;
  Slice SVar3;
  ostream *poVar4;
  type tVar5;
  long lVar6;
  long *plVar8;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attrName_03;
  string_view attrName_04;
  string_view attribute;
  string_view attribute_00;
  string_view attribute_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view attribute_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view attribute_03;
  string_view attribute_04;
  string_view attribute_05;
  string_view attribute_06;
  Slice s;
  Slice qux;
  Builder b;
  uint8_t *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  long *local_128 [2];
  long local_118 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  uint8_t *local_f0;
  byte *local_e8;
  Builder local_e0;
  int iVar7;
  
  arangodb::velocypack::Builder::Builder(&local_e0);
  arangodb::velocypack::Value::Value((Value *)&local_148,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,(Value *)&local_148);
  local_148._M_dataplus._M_p._0_1_ = 0xb;
  local_148._M_dataplus._M_p._4_4_ = 3;
  local_148._M_string_length = 0x2a;
  attrName._M_str = "foo";
  attrName._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,attrName,(Value *)&local_148);
  local_148._M_dataplus._M_p._0_1_ = 0xe;
  local_148._M_dataplus._M_p._4_4_ = 6;
  local_148._M_string_length = 0x113044;
  attrName_00._M_str = "bar";
  attrName_00._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,attrName_00,(Value *)&local_148);
  arangodb::velocypack::Value::Value((Value *)&local_148,Object,false);
  attrName_01._M_str = "baz";
  attrName_01._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,attrName_01,(Value *)&local_148);
  local_148._M_dataplus._M_p._0_1_ = 3;
  local_148._M_dataplus._M_p._4_4_ = 1;
  local_148._M_string_length = CONCAT71(local_148._M_string_length._1_7_,1);
  attrName_02._M_str = "qux";
  attrName_02._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,attrName_02,(Value *)&local_148);
  local_148._M_dataplus._M_p._0_1_ = 0xe;
  local_148._M_dataplus._M_p._4_4_ = 6;
  local_148._M_string_length = 0x113063;
  attrName_03._M_str = "bart";
  attrName_03._M_len = 4;
  iVar7 = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,attrName_03,(Value *)&local_148);
  arangodb::velocypack::Builder::close(&local_e0,iVar7);
  local_148._M_dataplus._M_p._0_1_ = 0xb;
  local_148._M_dataplus._M_p._4_4_ = 3;
  local_148._M_string_length = 0x3039;
  attrName_04._M_str = "quux";
  attrName_04._M_len = 4;
  iVar7 = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,attrName_04,(Value *)&local_148);
  arangodb::velocypack::Builder::close(&local_e0,iVar7);
  local_150 = arangodb::velocypack::Builder::start(&local_e0);
  attribute._M_str = "bar";
  attribute._M_len = 3;
  SVar3 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::get((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_150,
                attribute);
  if (arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start] != None) {
    attribute_00._M_str = "bar";
    attribute_00._M_len = 3;
    SVar3 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_150,attribute_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\'bar\' attribute value has type: ",0x20);
    poVar4 = operator<<((ostream *)&std::cout,
                        arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  attribute_01._M_str = "quetzal";
  attribute_01._M_len = 7;
  SVar3 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::get((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_150,
                attribute_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\'quetzal\' attribute value has type: ",0x24);
  poVar4 = operator<<((ostream *)&std::cout,
                      arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\'quetzal\' attribute is None: ",0x1d);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       | 1;
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar1 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"baz","");
  plVar8 = local_118;
  local_128[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"qux","");
  __l._M_len = 2;
  __l._M_array = &local_148;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l,(allocator_type *)&local_f0);
  local_e8 = (byte *)arangodb::velocypack::
                     SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
                     get<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                               ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                                 *)&local_150,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )local_108.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )local_108.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  lVar6 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\'baz\'.\'qux\' attribute has type: ",0x20);
  poVar4 = operator<<((ostream *)&std::cout,
                      arangodb::velocypack::SliceStaticData::TypeMap[*local_e8]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\'baz\'.\'qux\' attribute has bool value: ",0x26);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       | 1;
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBool
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_e8);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Complete value of \'baz\' is: ",0x1c);
  attribute_02._M_str = "baz";
  attribute_02._M_len = 3;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_150,attribute_02);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
  toJson_abi_cxx11_(&local_148,
                    (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_108
                    ,&arangodb::velocypack::Options::Defaults);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_148._M_dataplus._M_p,local_148._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"bark","");
  plVar8 = local_118;
  local_128[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"foobar","");
  __l_00._M_len = 2;
  __l_00._M_array = &local_148;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l_00,(allocator_type *)&local_f0);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
  get<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_150,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_108.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_108.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  lVar6 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\'bark\'.\'foobar\' attribute is None: ",0x23);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       | 1;
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"baz","");
  plVar8 = local_118;
  local_128[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"bart","");
  __l_01._M_len = 2;
  __l_01._M_array = &local_148;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l_01,(allocator_type *)&local_f0);
  tVar5 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
          get<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                     &local_150,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_108.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_108.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,false);
  VVar2 = arangodb::velocypack::SliceStaticData::TypeMap[*tVar5._start];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  lVar6 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if (VVar2 != None) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\'baz\'.\'bart\' attribute has type: ",0x21);
    attribute_03._M_str = "baz";
    attribute_03._M_len = 3;
    local_148._M_dataplus._M_p =
         (pointer)arangodb::velocypack::
                  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &local_150,attribute_03);
    attribute_04._M_str = "bart";
    attribute_04._M_len = 4;
    SVar3 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_148,attribute_04);
    poVar4 = operator<<((ostream *)&std::cout,
                        arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\'baz\'.\'bart\' attribute has value: \'",0x23);
    attribute_05._M_str = "baz";
    attribute_05._M_len = 3;
    local_f0 = (uint8_t *)
               arangodb::velocypack::
               SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          &local_150,attribute_05);
    attribute_06._M_str = "bart";
    attribute_06._M_len = 4;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)arangodb::velocypack::
                  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &local_f0,attribute_06);
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
    copyString_abi_cxx11_
              (&local_148,
               (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_108);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_148._M_dataplus._M_p,local_148._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  arangodb::velocypack::Builder::~Builder(&local_e0);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with a few members
  Builder b;

  b(Value(ValueType::Object));
  b.add("foo", Value(42));
  b.add("bar", Value("some string value"));
  b.add("baz", Value(ValueType::Object));
  b.add("qux", Value(true));
  b.add("bart", Value("this is a string"));
  b.close();
  b.add("quux", Value(12345));
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // now fetch the string in the object's "bar" attribute
  if (s.hasKey("bar")) {
    Slice bar(s.get("bar"));
    std::cout << "'bar' attribute value has type: " << bar.type() << std::endl;
  }

  // fetch non-existing attribute "quetzal"
  Slice quetzal(s.get("quetzal"));
  // note: this returns a slice of type None
  std::cout << "'quetzal' attribute value has type: " << quetzal.type()
            << std::endl;
  std::cout << "'quetzal' attribute is None: " << std::boolalpha
            << quetzal.isNone() << std::endl;

  // fetch subattribute "baz.qux"
  Slice qux(s.get(std::vector<std::string>({"baz", "qux"})));
  std::cout << "'baz'.'qux' attribute has type: " << qux.type() << std::endl;
  std::cout << "'baz'.'qux' attribute has bool value: " << std::boolalpha
            << qux.getBoolean() << std::endl;
  std::cout << "Complete value of 'baz' is: " << s.get("baz").toJson()
            << std::endl;

  // fetch non-existing subattribute "bark.foobar"
  Slice foobar(s.get(std::vector<std::string>({"bark", "foobar"})));
  std::cout << "'bark'.'foobar' attribute is None: " << std::boolalpha
            << foobar.isNone() << std::endl;

  // check if subattribute "baz"."bart" does exist
  if (s.hasKey(std::vector<std::string>({"baz", "bart"}))) {
    // access subattribute using operator syntax
    std::cout << "'baz'.'bart' attribute has type: " << s["baz"]["bart"].type()
              << std::endl;
    std::cout << "'baz'.'bart' attribute has value: '"
              << s["baz"]["bart"].copyString() << "'" << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}